

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O3

Value * Kvm::loadProc(Kvm *vm,Value *args)

{
  Value *v;
  Value *pVVar1;
  runtime_error *this;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  string msg;
  ifstream in;
  undefined1 *local_240 [2];
  undefined1 local_230 [16];
  long local_220 [3];
  byte abStack_207 [7];
  byte abStack_200 [488];
  
  std::ifstream::ifstream(local_220,(char *)args[1]._vptr_Value[3],_S_in);
  if ((abStack_200[*(long *)(local_220[0] + -0x18)] & 5) != 0) {
    local_240[0] = local_230;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"could not load file \"","")
    ;
    std::__cxx11::string::append((char *)local_240);
    std::__cxx11::string::append((char *)local_240);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,(string *)local_240);
    *(undefined ***)this = &PTR__runtime_error_00113b48;
    __cxa_throw(this,&(anonymous_namespace)::KatException::typeinfo,
                std::runtime_error::~runtime_error);
  }
  abStack_207[*(long *)(local_220[0] + -0x18)] = abStack_207[*(long *)(local_220[0] + -0x18)] & 0xef
  ;
  pVVar1 = (Value *)0x0;
  __buf = extraout_RDX;
  do {
    v = (Value *)read(vm,(int)local_220,__buf,in_RCX);
    if ((v == (Value *)0x0) ||
       (in_RCX = *(size_t *)(local_220[0] + -0x18), (abStack_200[in_RCX] & 5) != 0))
    goto LAB_00109b18;
    pVVar1 = eval(vm,v,vm->GLOBAL_ENV);
    __buf = extraout_RDX_00;
  } while (pVVar1 != (Value *)0x0);
  pVVar1 = (Value *)0x0;
LAB_00109b18:
  std::ifstream::~ifstream(local_220);
  return pVVar1;
}

Assistant:

const Value* Kvm::loadProc(Kvm *vm, const Value *args)
{
    const String *s = static_cast<const String *>(car(args));
    auto filename = s->value_;

    std::ifstream in(filename);

    if (!in)
    {
        std::string msg("could not load file \"");
        msg.append(filename);
        msg.append("\"");
        throw KatException(msg);
    }

    const Value *v = nullptr;
    const Value *result = nullptr;

    in.unsetf(std::ios_base::skipws);
    while ((v = vm->read(in)) && in)
    {
        result = vm->eval(v, vm->GLOBAL_ENV);
        if (!result) return nullptr;
    }
    return result;
}